

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

iterator __thiscall
phmap::priv::
base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
::find(base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
       *this,key_type *key)

{
  _Rb_tree_const_iterator<int> checker_iter;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  iterator tree_iter;
  iterator iVar4;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  bVar3;
  
  tree_iter = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
              ::find<int>((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                           *)this,key);
  p_Var2 = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  checker_iter._M_node = &(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var1 = checker_iter._M_node;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (*key <= (int)p_Var2[1]._M_color) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < *key];
    } while (p_Var2 != (_Base_ptr)0x0);
  }
  if ((p_Var1 != checker_iter._M_node) && ((int)p_Var1[1]._M_color <= *key)) {
    checker_iter._M_node = p_Var1;
  }
  bVar3 = base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>,std::_Rb_tree_const_iterator<int>>
                    ((base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
                      *)this,tree_iter,checker_iter);
  iVar4.node = bVar3.node;
  iVar4.position = bVar3.position;
  iVar4._12_4_ = bVar3._12_4_;
  return iVar4;
}

Assistant:

iterator find(const key_type &key) {
        return iter_check(tree_.find(key), checker_.find(key));
    }